

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O3

bool flow::transform::rewriteBrToExit(IRHandler *handler)

{
  BasicBlock *this;
  BasicBlock *otherBB;
  bool bVar1;
  byte bVar2;
  TerminateInstr *pTVar3;
  long lVar4;
  long *plVar5;
  byte in_CL;
  _List_node_base *p_Var6;
  _Head_base<0UL,_flow::Instr_*,_false> local_40;
  _func_int **local_38;
  
  p_Var6 = (handler->blocks_).
           super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var6 == (_List_node_base *)&handler->blocks_) {
    bVar2 = 0;
  }
  else {
    do {
      this = (BasicBlock *)p_Var6[1]._M_next;
      pTVar3 = BasicBlock::getTerminator(this);
      if ((pTVar3 != (TerminateInstr *)0x0) &&
         (lVar4 = __dynamic_cast(pTVar3,&TerminateInstr::typeinfo,&BrInstr::typeinfo), lVar4 != 0))
      {
        otherBB = (BasicBlock *)**(undefined8 **)(lVar4 + 0x50);
        bVar2 = 1;
        if ((long)(otherBB->code_).
                  super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(otherBB->code_).
                  super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 8) goto LAB_0014d5ea;
        bVar1 = BasicBlock::isAfter(this,otherBB);
        if (bVar1) {
          in_CL = 0;
          bVar2 = 1;
          goto LAB_0014d658;
        }
        pTVar3 = BasicBlock::getTerminator(otherBB);
        if ((pTVar3 != (TerminateInstr *)0x0) &&
           (plVar5 = (long *)__dynamic_cast(pTVar3,&TerminateInstr::typeinfo,&RetInstr::typeinfo),
           plVar5 != (long *)0x0)) {
          BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffc8,(char *)this);
          if (local_38 != (_func_int **)0x0) {
            (**(code **)(*local_38 + 8))();
          }
          local_38 = (_func_int **)0x0;
          (**(code **)(*plVar5 + 0x18))(&local_40,plVar5);
          BasicBlock::push_back
                    (this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_40);
          if (local_40._M_head_impl != (Instr *)0x0) {
            (*((local_40._M_head_impl)->super_Value)._vptr_Value[1])();
          }
          bVar2 = 1;
          in_CL = 1;
          goto LAB_0014d658;
        }
      }
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)&handler->blocks_);
    bVar2 = 0;
LAB_0014d5ea:
    in_CL = 0;
  }
LAB_0014d658:
  return (bool)(bVar2 & in_CL);
}

Assistant:

bool rewriteBrToExit(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      BasicBlock* targetBB = br->targetBlock();

      if (targetBB->size() != 1)
        return false;

      if (bb->isAfter(targetBB))
        return false;

      if (RetInstr* ret = dynamic_cast<RetInstr*>(targetBB->getTerminator())) {
        bb->remove(br);
        bb->push_back(ret->clone());

        // FLOW_TRACE("flow: eliminate branch-to-exit block");
        return true;
      }
    }
  }

  return false;
}